

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_unknown_test.cc
# Opt level: O0

void __thiscall
CompareTest_UnknownFieldsReflexive_Test::~CompareTest_UnknownFieldsReflexive_Test
          (CompareTest_UnknownFieldsReflexive_Test *this)

{
  CompareTest_UnknownFieldsReflexive_Test *this_local;
  
  ~CompareTest_UnknownFieldsReflexive_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CompareTest, UnknownFieldsReflexive) {
  EXPECT_EQ(kUpb_UnknownCompareResult_Equal, CompareUnknown({}, {}));
  EXPECT_EQ(kUpb_UnknownCompareResult_Equal,
            CompareUnknown({{1, Varint(123)}, {2, Fixed32(456)}},
                           {{1, Varint(123)}, {2, Fixed32(456)}}));
  EXPECT_EQ(
      kUpb_UnknownCompareResult_Equal,
      CompareUnknown(
          {{1, Group({{2, Group({{3, Fixed32(456)}, {4, Fixed64(123)}})}})}},
          {{1, Group({{2, Group({{3, Fixed32(456)}, {4, Fixed64(123)}})}})}}));
}